

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall Lowerer::GenerateNonConfigurableLdRootFld(Lowerer *this,Instr *instrLdFld)

{
  SymOpnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  uint16 uVar4;
  uint sourceContextId;
  uint functionId;
  DWORD DVar5;
  undefined4 *puVar6;
  PropertySymOpnd *this_01;
  JITTimeFunctionBody *pJVar7;
  FunctionJITTimeInfo *this_02;
  intptr_t iVar8;
  RegOpnd *baseOpnd;
  MemRefOpnd *src;
  IndirOpnd *newSrc;
  
  this_00 = (SymOpnd *)instrLdFld->m_src1;
  OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar2 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_005c9463;
    *puVar6 = 0;
  }
  bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar3) {
    return false;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrLdFld->m_src1);
  if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
    return false;
  }
  bVar3 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableFieldLoad(this_01->objTypeSpecFldInfo);
  if (!bVar3) {
    return false;
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar7);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,RootObjectFldFastPathPhase,sourceContextId,functionId);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x197f,
                       "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::RootObjectFldFastPathPhase)), ((this->m_func)->GetSourceContextId()), ((this->m_func)->GetLocalFunctionId())))"
                       ,"!PHASE_OFF(Js::RootObjectFldFastPathPhase, this->m_func)");
    if (!bVar3) goto LAB_005c9463;
    *puVar6 = 0;
  }
  if (((instrLdFld->field_0x38 & 0x10) != 0) &&
     (bVar3 = IR::Instr::HasLazyBailOut(instrLdFld), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1980,"(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut())",
                       "!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut()");
    if (!bVar3) {
LAB_005c9463:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar3 = IR::Instr::HasLazyBailOut(instrLdFld);
  if (bVar3) {
    IR::Instr::ClearBailOutInfo(instrLdFld);
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  iVar8 = JITTimeFunctionBody::GetRootObject(pJVar7);
  if (((this_01->field_0x61 & 1) == 0) || (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0)
     ) {
    uVar4 = IR::PropertySymOpnd::GetSlotIndex(this_01);
    newSrc = (IndirOpnd *)
             IR::MemRefOpnd::New((void *)(iVar8 + (ulong)uVar4 * 8),TyVar,this->m_func,
                                 AddrOpndKindDynamicMisc);
  }
  else {
    baseOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
    DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
    src = IR::MemRefOpnd::New((void *)(iVar8 + (ulong)DVar5),TyUint64,this->m_func,
                              AddrOpndKindDynamicMisc);
    InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,instrLdFld,true);
    uVar4 = IR::PropertySymOpnd::GetSlotIndex(this_01);
    newSrc = IR::IndirOpnd::New(baseOpnd,(uint)uVar4 << 3,TyVar,this->m_func,false);
  }
  IR::Instr::ReplaceSrc1(instrLdFld,&newSrc->super_Opnd);
  instrLdFld->m_opcode = Ld_A;
  LowererMD::ChangeToAssign(instrLdFld);
  return true;
}

Assistant:

bool
Lowerer::GenerateNonConfigurableLdRootFld(IR::Instr * instrLdFld)
{
    if (!instrLdFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return false;
    }
    IR::PropertySymOpnd *propertySymOpnd = instrLdFld->GetSrc1()->AsPropertySymOpnd();
    if (!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())
    {
        return false;
    }

    Assert(!PHASE_OFF(Js::RootObjectFldFastPathPhase, this->m_func));
    Assert(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut());

    if (instrLdFld->HasLazyBailOut())
    {
        instrLdFld->ClearBailOutInfo();
    }

    IR::Opnd * srcOpnd;
    intptr_t rootObject = this->m_func->GetJITFunctionBody()->GetRootObject();
    if (propertySymOpnd->UsesAuxSlot())
    {
        IR::RegOpnd * auxSlotOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
        this->InsertMove(auxSlotOpnd, IR::MemRefOpnd::New((byte *)rootObject + Js::DynamicObject::GetOffsetOfAuxSlots(),
                TyMachPtr, this->m_func), instrLdFld);

        srcOpnd = IR::IndirOpnd::New(auxSlotOpnd, propertySymOpnd->GetSlotIndex() * sizeof(Js::Var *),
            TyVar, this->m_func);
    }
    else
    {
        srcOpnd = IR::MemRefOpnd::New((Js::Var *)rootObject + propertySymOpnd->GetSlotIndex(),
            TyVar, this->m_func);
    }
    instrLdFld->ReplaceSrc1(srcOpnd);
    instrLdFld->m_opcode = Js::OpCode::Ld_A;
    LowererMD::ChangeToAssign(instrLdFld);
    return true;
}